

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O2

void __thiscall
duckdb::CheckpointReader::ReadEntry
          (CheckpointReader *this,CatalogTransaction transaction,Deserializer *deserializer)

{
  CatalogType CVar1;
  InternalException *this_00;
  long lStack_50;
  allocator local_39;
  string local_38;
  
  CVar1 = Deserializer::ReadProperty<duckdb::CatalogType>(deserializer,99,"type");
  switch(CVar1) {
  case TABLE_ENTRY:
    lStack_50 = 0x28;
    break;
  case SCHEMA_ENTRY:
    lStack_50 = 0x20;
    break;
  case VIEW_ENTRY:
    lStack_50 = 0x30;
    break;
  case INDEX_ENTRY:
    lStack_50 = 0x50;
    break;
  case PREPARED_STATEMENT:
  case COLLATION_ENTRY:
switchD_01ac1f67_caseD_5:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Unrecognized catalog type in CheckpointWriter::WriteEntry",
               &local_39);
    InternalException::InternalException(this_00,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case SEQUENCE_ENTRY:
    lStack_50 = 0x38;
    break;
  case TYPE_ENTRY:
    lStack_50 = 0x58;
    break;
  default:
    if (CVar1 == MACRO_ENTRY) {
      lStack_50 = 0x40;
    }
    else {
      if (CVar1 != TABLE_MACRO_ENTRY) goto switchD_01ac1f67_caseD_5;
      lStack_50 = 0x48;
    }
  }
  (**(code **)((long)this->_vptr_CheckpointReader + lStack_50))(this,deserializer);
  return;
}

Assistant:

void CheckpointReader::ReadEntry(CatalogTransaction transaction, Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<CatalogType>(99, "type");

	switch (type) {
	case CatalogType::SCHEMA_ENTRY: {
		ReadSchema(transaction, deserializer);
		break;
	}
	case CatalogType::TYPE_ENTRY: {
		ReadType(transaction, deserializer);
		break;
	}
	case CatalogType::SEQUENCE_ENTRY: {
		ReadSequence(transaction, deserializer);
		break;
	}
	case CatalogType::TABLE_ENTRY: {
		ReadTable(transaction, deserializer);
		break;
	}
	case CatalogType::VIEW_ENTRY: {
		ReadView(transaction, deserializer);
		break;
	}
	case CatalogType::MACRO_ENTRY: {
		ReadMacro(transaction, deserializer);
		break;
	}
	case CatalogType::TABLE_MACRO_ENTRY: {
		ReadTableMacro(transaction, deserializer);
		break;
	}
	case CatalogType::INDEX_ENTRY: {
		ReadIndex(transaction, deserializer);
		break;
	}
	default:
		throw InternalException("Unrecognized catalog type in CheckpointWriter::WriteEntry");
	}
}